

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitContinueStatement(SyntaxDumper *this,ContinueStatementSyntax *node)

{
  SyntaxToken local_98;
  SyntaxToken local_50;
  ContinueStatementSyntax *local_18;
  ContinueStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ContinueStatementSyntax *)this;
  ContinueStatementSyntax::continueKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  ContinueStatementSyntax::semicolonToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  return Skip;
}

Assistant:

virtual Action visitContinueStatement(const ContinueStatementSyntax* node) override
    {
        terminal(node->continueKeyword(), node);
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }